

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miscellaneous.cpp
# Opt level: O3

void __thiscall chatra::TransferRequest::restore(TransferRequest *this,Reader *r)

{
  LockType LVar1;
  Requester RVar2;
  Reference RVar3;
  
  RVar2 = Reader::readRawInteger<unsigned_long>(r);
  this->requester = RVar2;
  RVar3 = Reader::readReference(r);
  (this->ref).node = RVar3.node;
  LVar1 = Reader::readRawInteger<int>(r);
  this->lockType = LVar1;
  return;
}

Assistant:

void TransferRequest::restore(Reader& r) {
	r.in(requester);
	ref = r.readReference();
	r.in(lockType);
}